

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O0

ssize_t __thiscall r_comp::Metadata::read(Metadata *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  Class *pCVar4;
  mapped_type *pmVar5;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint *puVar6;
  string local_200 [32];
  string local_1e0 [8];
  string name_4;
  size_t function_names_count;
  string local_198 [8];
  string name_3;
  size_t operator_names_count;
  string local_150 [8];
  string name_2;
  size_t class_names_count;
  string name_1;
  size_t sys_classes_count;
  string name;
  size_t classes_count;
  undefined1 local_80 [8];
  Class c;
  size_t offset;
  size_t i;
  size_t class_count;
  size_t size_local;
  uint32_t *data_local;
  Metadata *this_local;
  
  puVar6 = (uint *)CONCAT44(in_register_00000034,__fd);
  uVar1 = *puVar6;
  c.type = NUMBER;
  c.use_as = I_CLASS;
  for (offset = 0; offset < uVar1; offset = offset + 1) {
    Class::Class((Class *)local_80,ANY);
    Class::read((Class *)local_80,__fd + c.type * 4,__buf_00,c._64_8_);
    Class::Class((Class *)&classes_count,(Class *)local_80);
    r_code::vector<r_comp::Class>::push_back(&this->classes_by_opcodes,(Class *)&classes_count);
    Class::~Class((Class *)&classes_count);
    sVar2 = Class::get_size((Class *)local_80);
    c._64_8_ = sVar2 + c._64_8_;
    Class::~Class((Class *)local_80);
  }
  uVar1 = puVar6[c._64_8_];
  c._64_8_ = c._64_8_ + 1;
  for (offset = 0; offset < uVar1; offset = offset + 1) {
    r_code::ReadString_abi_cxx11_((uint *)&sys_classes_count);
    lVar3 = r_code::GetStringSize((string *)&sys_classes_count);
    lVar3 = c._64_8_ + lVar3;
    c._64_8_ = lVar3 + 1;
    pCVar4 = r_code::vector<r_comp::Class>::operator[]
                       (&this->classes_by_opcodes,(ulong)puVar6[lVar3]);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
             ::operator[](&this->classes,(key_type *)&sys_classes_count);
    Class::operator=(pmVar5,pCVar4);
    std::__cxx11::string::~string((string *)&sys_classes_count);
  }
  uVar1 = puVar6[c._64_8_];
  c._64_8_ = c._64_8_ + 1;
  for (offset = 0; offset < uVar1; offset = offset + 1) {
    r_code::ReadString_abi_cxx11_((uint *)&class_names_count);
    lVar3 = r_code::GetStringSize((string *)&class_names_count);
    lVar3 = c._64_8_ + lVar3;
    c._64_8_ = lVar3 + 1;
    pCVar4 = r_code::vector<r_comp::Class>::operator[]
                       (&this->classes_by_opcodes,(ulong)puVar6[lVar3]);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
             ::operator[](&this->sys_classes,(key_type *)&class_names_count);
    Class::operator=(pmVar5,pCVar4);
    std::__cxx11::string::~string((string *)&class_names_count);
  }
  uVar1 = puVar6[c._64_8_];
  c._64_8_ = c._64_8_ + 1;
  for (offset = 0; offset < uVar1; offset = offset + 1) {
    r_code::ReadString_abi_cxx11_((uint *)local_150);
    std::__cxx11::string::string((string *)&operator_names_count,local_150);
    r_code::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::push_back(&this->class_names,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &operator_names_count);
    std::__cxx11::string::~string((string *)&operator_names_count);
    lVar3 = r_code::GetStringSize(local_150);
    c._64_8_ = lVar3 + c._64_8_;
    std::__cxx11::string::~string(local_150);
  }
  uVar1 = puVar6[c._64_8_];
  c._64_8_ = c._64_8_ + 1;
  for (offset = 0; offset < uVar1; offset = offset + 1) {
    r_code::ReadString_abi_cxx11_((uint *)local_198);
    std::__cxx11::string::string((string *)&function_names_count,local_198);
    r_code::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::push_back(&this->operator_names,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &function_names_count);
    std::__cxx11::string::~string((string *)&function_names_count);
    lVar3 = r_code::GetStringSize(local_198);
    c._64_8_ = lVar3 + c._64_8_;
    std::__cxx11::string::~string(local_198);
  }
  uVar1 = puVar6[c._64_8_];
  c._64_8_ = c._64_8_ + 1;
  for (offset = 0; offset < uVar1; offset = offset + 1) {
    r_code::ReadString_abi_cxx11_((uint *)local_1e0);
    std::__cxx11::string::string(local_200,local_1e0);
    r_code::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::push_back(&this->function_names,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    std::__cxx11::string::~string(local_200);
    lVar3 = r_code::GetStringSize(local_1e0);
    c._64_8_ = lVar3 + c._64_8_;
    std::__cxx11::string::~string(local_1e0);
  }
  return offset;
}

Assistant:

void Metadata::read(uint32_t *data, size_t size)
{
    size_t class_count = data[0];
    size_t i;
    size_t offset = 1;

    for (i = 0; i < class_count; ++i) {
        Class c;
        c.read(data + offset);
        classes_by_opcodes.push_back(c);
        offset += c.get_size();
    }

    size_t classes_count = data[offset++];

    for (i = 0; i < classes_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        offset += r_code::GetStringSize(name);
        classes[name] = classes_by_opcodes[data[offset++]];
    }

    size_t sys_classes_count = data[offset++];

    for (i = 0; i < sys_classes_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        offset += r_code::GetStringSize(name);
        sys_classes[name] = classes_by_opcodes[data[offset++]];
    }

    size_t class_names_count = data[offset++];

    for (i = 0; i < class_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        class_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }

    size_t operator_names_count = data[offset++];

    for (i = 0; i < operator_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        operator_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }

    size_t function_names_count = data[offset++];

    for (i = 0; i < function_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        function_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }
}